

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffer.cpp
# Opt level: O2

void __thiscall
helics::LogBuffer::push(LogBuffer *this,int logLevel,string_view header,string_view message)

{
  size_type sVar1;
  handle block;
  int local_4c;
  handle local_48;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_30._M_str = message._M_str;
  local_30._M_len = message._M_len;
  local_20._M_str = header._M_str;
  local_20._M_len = header._M_len;
  if ((this->mMaxSize).super___atomic_base<unsigned_long>._M_i != 0) {
    local_4c = logLevel;
    gmlc::libguarded::
    shared_guarded<std::deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_timed_mutex>
    ::lock(&local_48,&this->mBuffer);
    sVar1 = std::
            deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_48.data);
    if (sVar1 == (this->mMaxSize).super___atomic_base<unsigned_long>._M_i) {
      std::
      deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop_front((deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_48.data);
    }
    std::
    deque<std::tuple<int,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<int,std::__cxx11::string,std::__cxx11::string>>>
    ::
    emplace_back<int&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              ((deque<std::tuple<int,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<int,std::__cxx11::string,std::__cxx11::string>>>
                *)local_48.data,&local_4c,&local_20,&local_30);
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_48.m_handle_lock);
  }
  return;
}

Assistant:

void LogBuffer::push(int logLevel, std::string_view header, std::string_view message)
{
    if (mMaxSize.load() == 0) {
        return;
    }
    auto block = mBuffer.lock();
    if (block->size() == mMaxSize.load()) {
        block->pop_front();
    }
    block->emplace_back(logLevel, header, message);
}